

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall Matrix::append(Matrix *this,QpVector *vec)

{
  HighsInt *pHVar1;
  iterator iVar2;
  iterator __position;
  int iVar3;
  ulong in_RAX;
  int *__args;
  double *__args_00;
  long lVar4;
  long lVar5;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (((this->mat).num_col == 0) &&
     (iVar2._M_current =
           (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish,
     iVar2._M_current ==
     (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
     ._M_start)) {
    local_38 = in_RAX & 0xffffffff;
    if (iVar2._M_current ==
        (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&(this->mat).start,iVar2,(int *)((long)&local_38 + 4));
    }
    else {
      *iVar2._M_current = 0;
      (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  iVar3 = vec->num_nz;
  if (0 < iVar3) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      __args = (int *)((long)(vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar5);
      iVar2._M_current =
           (this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(this->mat).index,iVar2,__args);
      }
      else {
        *iVar2._M_current = *__args;
        (this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      __args_00 = (vec->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  *(int *)((long)(vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar5);
      __position._M_current =
           (this->mat).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mat).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&(this->mat).value,__position,__args_00)
        ;
      }
      else {
        *__position._M_current = *__args_00;
        (this->mat).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar4 = lVar4 + 1;
      iVar3 = vec->num_nz;
      lVar5 = lVar5 + 4;
    } while (lVar4 < iVar3);
  }
  iVar3 = iVar3 + (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(this->mat).num_col];
  local_38 = CONCAT44(local_38._4_4_,iVar3);
  iVar2._M_current =
       (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->mat).start,iVar2,(int *)&local_38);
  }
  else {
    *iVar2._M_current = iVar3;
    (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  pHVar1 = &(this->mat).num_col;
  *pHVar1 = *pHVar1 + 1;
  this->has_transpose = false;
  return;
}

Assistant:

void append(const QpVector& vec) {
    if (mat.num_col == 0 && mat.start.size() == 0) {
      mat.start.push_back(0);
    }
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      mat.index.push_back(vec.index[i]);
      mat.value.push_back(vec.value[vec.index[i]]);
    }
    mat.start.push_back(mat.start[mat.num_col] + vec.num_nz);
    mat.num_col++;
    has_transpose = false;
  }